

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

string * __thiscall
runtime::VirtualMachine::byteCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,ByteCode bc,bool panic)

{
  allocator<char> local_362;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  allocator<char> local_2f0;
  allocator<char> local_2ef;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  allocator<char> local_2e8;
  allocator<char> local_2e7;
  allocator<char> local_2e6;
  allocator<char> local_2e5;
  allocator<char> local_2e4;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator<char> local_259;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator<char> local_211;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [19];
  allocator<char> local_2a;
  undefined1 local_29;
  VirtualMachine *pVStack_28;
  bool panic_local;
  VirtualMachine *this_local;
  ByteCode bc_local;
  
  bc_local._0_8_ = bc.parameter;
  this_local._0_4_ = bc.instruction;
  local_29 = panic;
  pVStack_28 = this;
  bc_local.parameter = (size_t)__return_storage_ptr__;
  switch((ByteCodeInstruction)this_local) {
  case Halt:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Halt",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case Add:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Add",local_3d);
    std::allocator<char>::~allocator(local_3d);
    break;
  case Subtract:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Subtract",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case Multiply:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Multiply",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case Divide:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Divide",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  case Print:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Print",&local_41);
    std::allocator<char>::~allocator(&local_41);
    break;
  case Read:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Read",&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  case Jump:
    std::__cxx11::to_string(&local_88,bc_local._0_8_);
    std::operator+(&local_68,"Jump(",&local_88);
    std::operator+(__return_storage_ptr__,&local_68,")");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case JumpIfFalse:
    std::__cxx11::to_string(&local_c8,bc_local._0_8_);
    std::operator+(&local_a8,"JumpIfFalse(",&local_c8);
    std::operator+(__return_storage_ptr__,&local_a8,")");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    break;
  case LoadIntegerConstant:
    std::__cxx11::to_string(&local_108,bc_local._0_8_);
    std::operator+(&local_e8,"LoadIntegerConstant(",&local_108);
    std::operator+(__return_storage_ptr__,&local_e8,")");
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    break;
  case LoadFloatConstant:
    std::__cxx11::to_string(&local_148,bc_local._0_8_);
    std::operator+(&local_128,"LoadFloatConstant(",&local_148);
    std::operator+(__return_storage_ptr__,&local_128,")");
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    break;
  case LoadStringConstant:
    std::__cxx11::to_string(&local_188,bc_local._0_8_);
    std::operator+(&local_168,"LoadStringConstant(",&local_188);
    std::operator+(__return_storage_ptr__,&local_168,")");
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    break;
  case LoadUndefinedConstant:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LoadUndefinedConstant",&local_189);
    std::allocator<char>::~allocator(&local_189);
    break;
  case LoadBooleanTrueConstant:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LoadBooleanTrueConstant",&local_18a);
    std::allocator<char>::~allocator(&local_18a);
    break;
  case LoadBooleanFalseConstant:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LoadBooleanFalseConstant",&local_18b);
    std::allocator<char>::~allocator(&local_18b);
    break;
  case LoadLocal:
    std::__cxx11::to_string(&local_1d0,bc_local._0_8_);
    std::operator+(&local_1b0,"LoadLocal(",&local_1d0);
    std::operator+(__return_storage_ptr__,&local_1b0,")");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    break;
  case SetLocal:
    std::__cxx11::to_string(&local_210,bc_local._0_8_);
    std::operator+(&local_1f0,"SetLocal(",&local_210);
    std::operator+(__return_storage_ptr__,&local_1f0,")");
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    break;
  case Return:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Return",&local_211);
    std::allocator<char>::~allocator(&local_211);
    break;
  case Invoke:
    std::__cxx11::to_string(&local_258,bc_local._0_8_);
    std::operator+(&local_238,"Invoke(",&local_258);
    std::operator+(__return_storage_ptr__,&local_238,")");
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    break;
  case NoOp:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NoOp",&local_259);
    std::allocator<char>::~allocator(&local_259);
    break;
  case MakeFn:
    std::__cxx11::to_string(&local_2a0,bc_local._0_8_);
    std::operator+(&local_280,"MakeFn(",&local_2a0);
    std::operator+(__return_storage_ptr__,&local_280,")");
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    break;
  case MakeObj:
    std::__cxx11::to_string(&local_2e0,bc_local._0_8_);
    std::operator+(&local_2c0,"MakeObj(",&local_2e0);
    std::operator+(__return_storage_ptr__,&local_2c0,")");
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    break;
  case Less:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Less",&local_2e1);
    std::allocator<char>::~allocator(&local_2e1);
    break;
  case LessOrEqual:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LessOrEqual",&local_2e2);
    std::allocator<char>::~allocator(&local_2e2);
    break;
  case Greater:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Greater",&local_2e3);
    std::allocator<char>::~allocator(&local_2e3);
    break;
  case GreaterOrEqual:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GreaterOrEqual",&local_2e4);
    std::allocator<char>::~allocator(&local_2e4);
    break;
  case Not:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Not",&local_2e5);
    std::allocator<char>::~allocator(&local_2e5);
    break;
  case Equal:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Equal",&local_2e6);
    std::allocator<char>::~allocator(&local_2e6);
    break;
  case NotEqual:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NotEqual",&local_2e7);
    std::allocator<char>::~allocator(&local_2e7);
    break;
  case And:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"And",&local_2e8);
    std::allocator<char>::~allocator(&local_2e8);
    break;
  case Or:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Or",&local_2e9);
    std::allocator<char>::~allocator(&local_2e9);
    break;
  case GetType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GetType",&local_2ea);
    std::allocator<char>::~allocator(&local_2ea);
    break;
  case CastToInt:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CastToInt",&local_2eb);
    std::allocator<char>::~allocator(&local_2eb);
    break;
  case CastToFloat:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CastToFloat",&local_2ec);
    std::allocator<char>::~allocator(&local_2ec);
    break;
  case Length:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Length",&local_2ed);
    std::allocator<char>::~allocator(&local_2ed);
    break;
  case ChatAt:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ChatAt",&local_2ee);
    std::allocator<char>::~allocator(&local_2ee);
    break;
  case StringAppend:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"StringAppend",&local_2ef);
    std::allocator<char>::~allocator(&local_2ef);
    break;
  case ObjectGet:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ObjectGet",&local_2f0);
    std::allocator<char>::~allocator(&local_2f0);
    break;
  case ObjectSet:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ObjectSet",&local_2f1);
    std::allocator<char>::~allocator(&local_2f1);
    break;
  case GetEnv:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GetEnv",&local_2f2);
    std::allocator<char>::~allocator(&local_2f2);
    break;
  case LoadClosure:
    std::__cxx11::to_string(&local_338,bc_local._0_8_);
    std::operator+(&local_318,"LoadClosure(",&local_338);
    std::operator+(__return_storage_ptr__,&local_318,")");
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    break;
  case Pop:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Pop",&local_339);
    std::allocator<char>::~allocator(&local_339);
    break;
  default:
    if (panic) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"Unkown bytecode instruction encountered",&local_361);
      VirtualMachine::panic(this,&local_360);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<UNKNOWN>",&local_362);
    std::allocator<char>::~allocator(&local_362);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string runtime::VirtualMachine::byteCodeToString(bytecode::ByteCode bc, bool panic) {

  #define PARAM "(" + std::to_string(bc.parameter) + ")"

  switch (bc.instruction) {
    case bytecode::ByteCodeInstruction::Halt: return "Halt";
    case bytecode::ByteCodeInstruction::Add: return "Add";
    case bytecode::ByteCodeInstruction::Subtract: return "Subtract";
    case bytecode::ByteCodeInstruction::Multiply: return "Multiply";
    case bytecode::ByteCodeInstruction::Divide: return "Divide";
    case bytecode::ByteCodeInstruction::Print: return "Print";
    case bytecode::ByteCodeInstruction::Read: return "Read";
    case bytecode::ByteCodeInstruction::Jump: return "Jump" PARAM;
    case bytecode::ByteCodeInstruction::JumpIfFalse: return "JumpIfFalse" PARAM;
    case bytecode::ByteCodeInstruction::LoadIntegerConstant: return "LoadIntegerConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadFloatConstant: return "LoadFloatConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadStringConstant: return "LoadStringConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadUndefinedConstant: return "LoadUndefinedConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanTrueConstant: return "LoadBooleanTrueConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanFalseConstant: return "LoadBooleanFalseConstant";
    case bytecode::ByteCodeInstruction::LoadLocal: return "LoadLocal" PARAM;
    case bytecode::ByteCodeInstruction::SetLocal: return "SetLocal" PARAM;
    case bytecode::ByteCodeInstruction::Return: return "Return";
    case bytecode::ByteCodeInstruction::Invoke: return "Invoke" PARAM;
    case bytecode::ByteCodeInstruction::NoOp: return "NoOp";
    case bytecode::ByteCodeInstruction::MakeFn: return "MakeFn" PARAM;
    case bytecode::ByteCodeInstruction::MakeObj: return "MakeObj" PARAM;
    case bytecode::ByteCodeInstruction::Less: return "Less";
    case bytecode::ByteCodeInstruction::LessOrEqual: return "LessOrEqual";
    case bytecode::ByteCodeInstruction::Greater: return "Greater";
    case bytecode::ByteCodeInstruction::GreaterOrEqual: return "GreaterOrEqual";
    case bytecode::ByteCodeInstruction::Not: return "Not";
    case bytecode::ByteCodeInstruction::Equal: return "Equal";
    case bytecode::ByteCodeInstruction::NotEqual: return "NotEqual";
    case bytecode::ByteCodeInstruction::And: return "And";
    case bytecode::ByteCodeInstruction::Or: return "Or";
    case bytecode::ByteCodeInstruction::GetType: return "GetType";
    case bytecode::ByteCodeInstruction::CastToInt: return "CastToInt";
    case bytecode::ByteCodeInstruction::CastToFloat: return "CastToFloat";
    case bytecode::ByteCodeInstruction::Length: return "Length";
    case bytecode::ByteCodeInstruction::ChatAt: return "ChatAt";
    case bytecode::ByteCodeInstruction::StringAppend: return "StringAppend";
    case bytecode::ByteCodeInstruction::ObjectGet: return "ObjectGet";
    case bytecode::ByteCodeInstruction::ObjectSet: return "ObjectSet";
    case bytecode::ByteCodeInstruction::GetEnv: return "GetEnv";
    case bytecode::ByteCodeInstruction::LoadClosure: return "LoadClosure" PARAM;
    case bytecode::ByteCodeInstruction::Pop: return "Pop";
    default: {
      if (panic) {
        this->panic("Unkown bytecode instruction encountered");
        return "";
      } else {
        return "<UNKNOWN>";
      }
    }
  }

  #undef PARAM
}